

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  GLFWmonitor *pGVar1;
  GLFWvidmode *pGVar2;
  int ypos;
  int xpos;
  int width;
  int height;
  int refreshRate;
  
  glfwGetTime();
  printf("%0.2f Key %s\n");
  if (action == 1) {
    if (key < 0x100) {
      if (key == 0x49) {
        glfwIconifyWindow(window);
        return;
      }
      if (key == 0x4d) {
        glfwMaximizeWindow(window);
        return;
      }
      if (key == 0x52) {
        glfwRestoreWindow(window);
        return;
      }
    }
    else {
      if (key == 0x100) {
        glfwSetWindowShouldClose(window,1);
        return;
      }
      if (((key == 0x101) || (key == 300)) && (mods == 4)) {
        pGVar1 = glfwGetWindowMonitor(window);
        if (pGVar1 == (GLFWmonitor *)0x0) {
          pGVar1 = glfwGetPrimaryMonitor();
          if (pGVar1 == (GLFWmonitor *)0x0) {
            return;
          }
          pGVar2 = glfwGetVideoMode(pGVar1);
          glfwGetWindowPos(window,&windowed_xpos,&windowed_ypos);
          glfwGetWindowSize(window,&windowed_width,&windowed_height);
          width = pGVar2->width;
          height = pGVar2->height;
          refreshRate = pGVar2->refreshRate;
          xpos = 0;
          ypos = 0;
        }
        else {
          refreshRate = 0;
          pGVar1 = (GLFWmonitor *)0x0;
          xpos = windowed_xpos;
          ypos = windowed_ypos;
          width = windowed_width;
          height = windowed_height;
        }
        glfwSetWindowMonitor(window,pGVar1,xpos,ypos,width,height,refreshRate);
      }
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    printf("%0.2f Key %s\n",
           glfwGetTime(),
           action == GLFW_PRESS ? "pressed" : "released");

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_I:
            glfwIconifyWindow(window);
            break;
        case GLFW_KEY_M:
            glfwMaximizeWindow(window);
            break;
        case GLFW_KEY_R:
            glfwRestoreWindow(window);
            break;
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
        case GLFW_KEY_F11:
        case GLFW_KEY_ENTER:
        {
            if (mods != GLFW_MOD_ALT)
                return;

            if (glfwGetWindowMonitor(window))
            {
                glfwSetWindowMonitor(window, NULL,
                                     windowed_xpos, windowed_ypos,
                                     windowed_width, windowed_height,
                                     0);
            }
            else
            {
                GLFWmonitor* monitor = glfwGetPrimaryMonitor();
                if (monitor)
                {
                    const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                    glfwGetWindowPos(window, &windowed_xpos, &windowed_ypos);
                    glfwGetWindowSize(window, &windowed_width, &windowed_height);
                    glfwSetWindowMonitor(window, monitor,
                                         0, 0, mode->width, mode->height,
                                         mode->refreshRate);
                }
            }

            break;
        }
    }
}